

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeIncPruneBGPlanner.cpp
# Opt level: O0

VectorSet * __thiscall
TreeIncPruneBGPlanner::CrossSumNode
          (TreeIncPruneBGPlanner *this,Index a,Index depth,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *jpol)

{
  bool bVar1;
  reference pvVar2;
  TreeIncPruneBGPlanner *this_00;
  TreeIncPruneBGPlanner *this_01;
  TreeIncPruneBGPlanner *pTVar3;
  reference pvVar4;
  const_reference pvVar5;
  VectorSet *this_02;
  long in_RSI;
  VectorSet *in_RDI;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_R8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_00000028;
  Index in_stack_00000030;
  Index in_stack_00000034;
  TreeIncPruneBGPlanner *in_stack_00000038;
  VectorSet *Gaoa;
  Index k;
  vector<unsigned_int,_std::allocator<unsigned_int>_> as;
  vector<unsigned_int,_std::allocator<unsigned_int>_> os;
  VectorSet *G;
  size_type in_stack_fffffffffffffeb8;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_stack_fffffffffffffec0;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  value_type in_stack_fffffffffffffed4;
  TreeIncPruneBGPlanner *in_stack_fffffffffffffed8;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffee0;
  VectorSet *in_stack_ffffffffffffff18;
  VectorSet *in_stack_ffffffffffffff20;
  AlphaVectorPlanning *in_stack_ffffffffffffff28;
  VectorSet *in_stack_ffffffffffffff38;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_ffffffffffffff40;
  Index in_stack_ffffffffffffff48;
  Index in_stack_ffffffffffffff4c;
  TreeIncPruneBGPlanner *in_stack_ffffffffffffff50;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_ffffffffffffff58;
  Index in_stack_ffffffffffffff60;
  Index in_stack_ffffffffffffff64;
  TreeIncPruneBGPlanner *in_stack_ffffffffffffff68;
  uint local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  undefined1 local_21;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_20;
  
  local_20 = in_R8;
  pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  *pvVar2 = *pvVar2 + 1;
  *(long *)(in_RSI + 0x1d8) = *(long *)(in_RSI + 0x1d8) + 1;
  local_21 = 0;
  boost::numeric::ublas::
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::matrix(in_stack_fffffffffffffee0);
  bVar1 = CheckCache_CrossSum(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                              in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                              (VectorSet *)in_stack_ffffffffffffff50);
  if (!bVar1) {
    GetObservationsFromDepth(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
    this_00 = (TreeIncPruneBGPlanner *)
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::size(local_20);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9459b2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
               (size_type)in_stack_fffffffffffffed8,
               (allocator_type *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9459d8);
    local_70 = 0;
    while( true ) {
      this_01 = (TreeIncPruneBGPlanner *)(ulong)local_70;
      pTVar3 = (TreeIncPruneBGPlanner *)
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_68);
      if (this_01 == pTVar3) break;
      in_stack_fffffffffffffec8 =
           (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
            *)std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[](local_20,(ulong)local_70);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_50,(ulong)local_70);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_fffffffffffffec8,(ulong)*pvVar4);
      in_stack_fffffffffffffed4 = *pvVar5;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_68,(ulong)local_70);
      *pvVar4 = in_stack_fffffffffffffed4;
      local_70 = local_70 + 1;
    }
    this_02 = GetGaoa(this_00,(Index)((ulong)this_01 >> 0x20),
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      in_stack_fffffffffffffec8);
    UnionNode(in_stack_00000038,in_stack_00000034,in_stack_00000030,in_stack_00000028);
    AlphaVectorPlanning::CrossSum
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::operator=((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                in_stack_fffffffffffffec8);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::~matrix(this_02);
    boost::numeric::ublas::
    matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::~matrix(this_02);
    if ((*(byte *)(in_RSI + 0x215) & 1) != 0) {
      PruneAfterCrossSum(this_01,in_stack_fffffffffffffed4,in_stack_fffffffffffffec8);
      boost::numeric::ublas::
      matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::operator=((matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                  in_stack_fffffffffffffec8);
      boost::numeric::ublas::
      matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::~matrix(this_02);
    }
    AddToCache_CrossSum(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                        in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                        in_stack_ffffffffffffff38);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  }
  return in_RDI;
}

Assistant:

VectorSet
TreeIncPruneBGPlanner::CrossSumNode(Index a,
                                    Index depth,
                                    const vector<vector<Index> > &jpol)
{
    _m_cs_nodes_at_level.at(depth)++;
    _m_nodes_visited++;

    VectorSet G;
    if(CheckCache_CrossSum(a,depth,jpol,G))
    {
        // G has now been filled by the cache
    }
    else
    {
        vector<Index> os=GetObservationsFromDepth(depth);

#if DEBUG_TreeIncPruneBGPlannerVerbose
        cout << "CrossSumNode: a=" << a << ",d=" << depth << "(obs="
             << SoftPrintVector(os) << "),jpol="
             << SoftPrintJpol(jpol) << endl;
#endif

        // figure out which a,o,aPrime we need to get
        
        vector<Index> as(jpol.size());
        for(Index k=0;k!=as.size();++k)
            as[k]=jpol[k][os[k]];
        VectorSet *Gaoa=GetGaoa(a,os,as);

        G=CrossSum(*Gaoa,
                   UnionNode(a,
                             depth+1, // we up the depth
                             jpol));
        if(_m_pruneAfterCrossSum)
            G=PruneAfterCrossSum(depth, G);
        AddToCache_CrossSum(a, depth, jpol, G);
    }

    return(G);
}